

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::generate_interface(SystemVerilogCodeGen *this,Generator *generator)

{
  long lVar1;
  long lVar2;
  undefined1 local_50 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::InterfaceInstantiationStmt> s;
  
  lVar1 = (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    lVar1 = lVar1 >> 4;
    lVar2 = 0;
    do {
      Generator::get_stmt((Generator *)local_50,(uint32_t)generator);
      if (*(int *)((long)local_50 + 0x78) == 6) {
        Stmt::as<kratos::InterfaceInstantiationStmt>
                  ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        stmt_code(this,(InterfaceInstantiationStmt *)
                       stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
        if (s.super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     s.
                     super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
      }
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 + (ulong)(lVar1 == 0) != lVar2);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::generate_interface(Generator* generator) {
    uint64_t stmt_count = generator->stmts_count();
    for (uint64_t i = 0; i < stmt_count; i++) {
        auto stmt = generator->get_stmt(i);
        if (stmt->type() == StatementType::InterfaceInstantiation) {
            auto s = stmt->as<InterfaceInstantiationStmt>();
            stmt_code(s.get());
        }
    }
}